

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AssertionItemPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssertionItemPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::syntax::EqualsAssertionArgClauseSyntax*>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,DataTypeSyntax *args_3,Token *args_4,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_5,
          EqualsAssertionArgClauseSyntax **args_6)

{
  Token direction;
  Token local;
  Token name;
  AssertionItemPortSyntax *pAVar1;
  undefined8 in_RCX;
  Info *in_RDX;
  undefined8 unaff_RBX;
  DataTypeSyntax *in_RDI;
  Info *in_R8;
  undefined8 in_R9;
  Info *unaff_retaddr;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_stack_00000008;
  EqualsAssertionArgClauseSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  pAVar1 = (AssertionItemPortSyntax *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local.info = in_RDX;
  local.kind = (short)in_RCX;
  local._2_1_ = (char)((ulong)in_RCX >> 0x10);
  local.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  local.rawLen = (int)((ulong)in_RCX >> 0x20);
  direction.info = in_R8;
  direction.kind = (short)in_R9;
  direction._2_1_ = (char)((ulong)in_R9 >> 0x10);
  direction.numFlags.raw = (char)((ulong)in_R9 >> 0x18);
  direction.rawLen = (int)((ulong)in_R9 >> 0x20);
  name.info = unaff_retaddr;
  name.kind = (short)unaff_RBX;
  name._2_1_ = (char)((ulong)unaff_RBX >> 0x10);
  name.numFlags.raw = (char)((ulong)unaff_RBX >> 0x18);
  name.rawLen = (int)((ulong)unaff_RBX >> 0x20);
  slang::syntax::AssertionItemPortSyntax::AssertionItemPortSyntax
            ((AssertionItemPortSyntax *)in_RDX->location,
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDX->rawTextPtr,local,
             direction,in_RDI,name,in_stack_00000008,in_stack_00000010);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }